

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters_utils.c
# Opt level: O1

WEBP_FILTER_TYPE WebPEstimateBestFilter(uint8_t *data,int width,int height,int stride)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  undefined4 *__s;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  uint uVar19;
  uint uVar20;
  int bins [4] [16];
  long local_168;
  undefined4 local_138 [16];
  undefined4 auStack_f8 [16];
  undefined4 auStack_b8 [16];
  undefined4 auStack_78 [18];
  
  __s = local_138;
  memset(__s,0,0x100);
  if (3 < height) {
    lVar5 = (long)stride;
    lVar6 = lVar5 * 2;
    puVar10 = data + (lVar6 - width);
    puVar11 = data + lVar5 * 2;
    local_168 = 2;
    do {
      if (3 < width) {
        uVar13 = (uint)data[local_168 * lVar5];
        lVar14 = 2;
        do {
          uVar20 = (uint)puVar11[lVar14];
          uVar4 = uVar20 - uVar13;
          uVar19 = -uVar4;
          if (0 < (int)uVar4) {
            uVar19 = uVar4;
          }
          uVar9 = (uint)puVar11[lVar14] - (uint)puVar11[lVar14 + -1];
          uVar4 = -uVar9;
          if (0 < (int)uVar9) {
            uVar4 = uVar9;
          }
          uVar7 = uVar20 - puVar10[lVar14];
          uVar9 = -uVar7;
          if (0 < (int)uVar7) {
            uVar9 = uVar7;
          }
          iVar12 = ((uint)puVar10[lVar14] + (uint)puVar11[lVar14 + -1]) - (uint)puVar10[lVar14 + -1]
          ;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          uVar8 = uVar20 - iVar12;
          uVar7 = -uVar8;
          if (0 < (int)uVar8) {
            uVar7 = uVar8;
          }
          local_138[uVar19 >> 4] = 1;
          *(undefined4 *)((long)auStack_f8 + (ulong)(uVar4 >> 2 & 0x3c)) = 1;
          *(undefined4 *)((long)auStack_b8 + (ulong)(uVar9 >> 2 & 0x3c)) = 1;
          *(undefined4 *)((long)auStack_78 + (ulong)(uVar7 >> 2 & 0xfc)) = 1;
          uVar13 = uVar20 + uVar13 * 3 + 2 >> 2;
          lVar14 = lVar14 + 2;
        } while (lVar14 < width + -1);
      }
      local_168 = local_168 + 2;
      puVar10 = puVar10 + lVar6;
      puVar11 = puVar11 + lVar6;
    } while (local_168 < height + -1);
  }
  iVar12 = 0x7fffffff;
  uVar3 = 0;
  uVar2 = 0;
  do {
    lVar6 = 0;
    iVar15 = 0;
    iVar16 = 0;
    iVar17 = 0;
    iVar18 = 0;
    uVar13 = 0;
    uVar19 = 1;
    uVar4 = 2;
    uVar20 = 3;
    do {
      piVar1 = __s + lVar6;
      iVar15 = iVar15 + (-(uint)(0 < *piVar1) & uVar13);
      iVar16 = iVar16 + (-(uint)(0 < piVar1[1]) & uVar19);
      iVar17 = iVar17 + (-(uint)(0 < piVar1[2]) & uVar4);
      iVar18 = iVar18 + (-(uint)(0 < piVar1[3]) & uVar20);
      lVar6 = lVar6 + 4;
      uVar13 = uVar13 + 4;
      uVar19 = uVar19 + 4;
      uVar4 = uVar4 + 4;
      uVar20 = uVar20 + 4;
    } while (lVar6 != 0x10);
    iVar15 = iVar18 + iVar16 + iVar17 + iVar15;
    if (iVar15 < iVar12) {
      uVar2 = uVar3 & 0xffffffff;
      iVar12 = iVar15;
    }
    uVar3 = uVar3 + 1;
    __s = __s + 0x10;
  } while (uVar3 != 4);
  return (WEBP_FILTER_TYPE)uVar2;
}

Assistant:

WEBP_FILTER_TYPE WebPEstimateBestFilter(const uint8_t* data,
                                        int width, int height, int stride) {
  int i, j;
  int bins[WEBP_FILTER_LAST][SMAX];
  memset(bins, 0, sizeof(bins));

  // We only sample every other pixels. That's enough.
  for (j = 2; j < height - 1; j += 2) {
    const uint8_t* const p = data + j * stride;
    int mean = p[0];
    for (i = 2; i < width - 1; i += 2) {
      const int diff0 = SDIFF(p[i], mean);
      const int diff1 = SDIFF(p[i], p[i - 1]);
      const int diff2 = SDIFF(p[i], p[i - width]);
      const int grad_pred =
          GradientPredictor(p[i - 1], p[i - width], p[i - width - 1]);
      const int diff3 = SDIFF(p[i], grad_pred);
      bins[WEBP_FILTER_NONE][diff0] = 1;
      bins[WEBP_FILTER_HORIZONTAL][diff1] = 1;
      bins[WEBP_FILTER_VERTICAL][diff2] = 1;
      bins[WEBP_FILTER_GRADIENT][diff3] = 1;
      mean = (3 * mean + p[i] + 2) >> 2;
    }
  }
  {
    int filter;
    WEBP_FILTER_TYPE best_filter = WEBP_FILTER_NONE;
    int best_score = 0x7fffffff;
    for (filter = WEBP_FILTER_NONE; filter < WEBP_FILTER_LAST; ++filter) {
      int score = 0;
      for (i = 0; i < SMAX; ++i) {
        if (bins[filter][i] > 0) {
          score += i;
        }
      }
      if (score < best_score) {
        best_score = score;
        best_filter = (WEBP_FILTER_TYPE)filter;
      }
    }
    return best_filter;
  }
}